

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O3

bool __thiscall QPathEdit::setPath(QPathEdit *this,QString *path,bool allowInvalid)

{
  int iVar1;
  QString *pQVar2;
  bool bVar3;
  bool bVar4;
  QStringView QVar5;
  QStringView QVar6;
  int pseudo;
  QString local_78;
  QString local_60;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  undefined4 local_2c;
  
  QLineEdit::text();
  if (local_60.d.size == (path->d).size) {
    QVar5.m_data = local_60.d.ptr;
    QVar5.m_size = local_60.d.size;
    QVar6.m_data = (path->d).ptr;
    QVar6.m_size = local_60.d.size;
    iVar1 = QtPrivate::compareStrings(QVar5,QVar6,CaseSensitive);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
    }
  }
  bVar4 = true;
  if (!bVar3) {
    if (allowInvalid) {
      QLineEdit::setText((QString *)this->edit);
    }
    local_2c = 0;
    iVar1 = (**(code **)(*(long *)this->pathValidator + 0x60))(this->pathValidator,path);
    bVar4 = iVar1 == 2;
    if (bVar4) {
      local_60.d.d = (Data *)0x0;
      local_60.d.ptr = L"\\";
      local_60.d.size = 1;
      local_48 = (QArrayData *)0x0;
      local_40 = L"/";
      local_38 = 1;
      pQVar2 = (QString *)QString::replace(path,&local_60,(CaseSensitivity)&local_48);
      QString::operator=(&this->currentValidPath,pQVar2);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
        }
      }
      if (!allowInvalid) {
        QLineEdit::setText((QString *)this->edit);
      }
      local_78.d.d = (path->d).d;
      local_78.d.ptr = (path->d).ptr;
      local_78.d.size = (path->d).size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pathChanged(this,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool QPathEdit::setPath(QString path, bool allowInvalid) {
    if (edit->text() == path) {
		return true;
    }

    if(allowInvalid) {
		edit->setText(path);
    }

	int pseudo = 0;
	if(pathValidator->validate(path, pseudo) == QValidator::Acceptable) {
		currentValidPath = path.replace(QStringLiteral("\\"), QStringLiteral("/"));
        if(!allowInvalid) {
			edit->setText(path);
        }
		emit pathChanged(path);
		return true;
    } else {
		return false;
    }
}